

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool ghc::filesystem::create_directory(path *p,path *attributes,error_code *ec)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  value_type *pvVar4;
  error_code eVar5;
  bool local_119;
  undefined4 uStack_114;
  undefined4 uStack_104;
  undefined1 local_f8 [8];
  stat fileStat;
  mode_t attribs;
  file_status local_5c;
  byte local_51;
  file_status local_50;
  file_status local_48;
  file_status local_40;
  file_status fs;
  error_code tec;
  error_code *ec_local;
  path *attributes_local;
  path *p_local;
  
  std::error_code::error_code((error_code *)&fs);
  std::error_code::clear(ec);
  status((filesystem *)&local_40,p,(error_code *)&fs);
  file_status::file_status(&local_48,&local_40);
  bVar1 = status_known(&local_48);
  local_51 = 0;
  bVar2 = false;
  local_119 = false;
  if (bVar1) {
    file_status::file_status(&local_50,&local_40);
    local_51 = 1;
    bVar1 = exists(&local_50);
    local_119 = false;
    if (bVar1) {
      file_status::file_status(&local_5c,&local_40);
      bVar2 = true;
      local_119 = is_directory(&local_5c);
    }
  }
  if (bVar2) {
    file_status::~file_status(&local_5c);
  }
  if ((local_51 & 1) != 0) {
    file_status::~file_status(&local_50);
  }
  file_status::~file_status(&local_48);
  if (local_119 == false) {
    fileStat.__glibc_reserved[2]._0_4_ = 0x1ff;
    bVar2 = path::empty(attributes);
    if (!bVar2) {
      pvVar4 = path::c_str(attributes);
      iVar3 = stat(pvVar4,(stat *)local_f8);
      if (iVar3 != 0) {
        eVar5 = detail::make_system_error(0);
        *(ulong *)ec = CONCAT44(uStack_104,eVar5._M_value);
        ec->_M_cat = eVar5._M_cat;
        p_local._7_1_ = false;
        goto LAB_002cac29;
      }
      fileStat.__glibc_reserved[2]._0_4_ = (__mode_t)fileStat.st_nlink;
    }
    pvVar4 = path::c_str(p);
    iVar3 = mkdir(pvVar4,(__mode_t)fileStat.__glibc_reserved[2]);
    if (iVar3 == 0) {
      p_local._7_1_ = true;
    }
    else {
      eVar5 = detail::make_system_error(0);
      *(ulong *)ec = CONCAT44(uStack_114,eVar5._M_value);
      ec->_M_cat = eVar5._M_cat;
      p_local._7_1_ = false;
    }
  }
  else {
    p_local._7_1_ = false;
  }
LAB_002cac29:
  fileStat.__glibc_reserved[2]._4_4_ = 1;
  file_status::~file_status(&local_40);
  return p_local._7_1_;
}

Assistant:

GHC_INLINE bool create_directory(const path& p, const path& attributes, std::error_code& ec) noexcept
{
    std::error_code tec;
    ec.clear();
    auto fs = status(p, tec);
#ifdef LWG_2935_BEHAVIOUR
    if (status_known(fs) && exists(fs)) {
        return false;
    }
#else
    if (status_known(fs) && exists(fs) && is_directory(fs)) {
        return false;
    }
#endif
#ifdef GHC_OS_WINDOWS
    if (!attributes.empty()) {
        if (!::CreateDirectoryExW(GHC_NATIVEWP(attributes), GHC_NATIVEWP(p), NULL)) {
            ec = detail::make_system_error();
            return false;
        }
    }
    else if (!::CreateDirectoryW(GHC_NATIVEWP(p), NULL)) {
        ec = detail::make_system_error();
        return false;
    }
#else
    ::mode_t attribs = static_cast<mode_t>(perms::all);
    if (!attributes.empty()) {
        struct ::stat fileStat;
        if (::stat(attributes.c_str(), &fileStat) != 0) {
            ec = detail::make_system_error();
            return false;
        }
        attribs = fileStat.st_mode;
    }
    if (::mkdir(p.c_str(), attribs) != 0) {
        ec = detail::make_system_error();
        return false;
    }
#endif
    return true;
}